

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O2

void __thiscall
jsonnet::internal::FixIndentation::specs
          (FixIndentation *this,
          vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
          *specs,Indent *indent)

{
  pointer pCVar1;
  AST *pAVar2;
  ComprehensionSpec *spec;
  pointer pCVar3;
  uint line_up;
  Indent new_indent;
  
  pCVar3 = (specs->
           super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pCVar1 = (specs->
           super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pCVar3 == pCVar1) {
      return;
    }
    fill(this,&pCVar3->openFodder,true,true,indent->lineUp);
    if (pCVar3->kind == IF) {
LAB_001aad6e:
      line_up = this->column + 2;
      this->column = line_up;
      pAVar2 = left_recursive_deep(pCVar3->expr);
      new_indent = newIndent(this,&pAVar2->openFodder,indent,line_up);
      expr(this,pCVar3->expr,&new_indent,true);
    }
    else if (pCVar3->kind == FOR) {
      this->column = this->column + 3;
      fill(this,&pCVar3->varFodder,true,true,indent->lineUp);
      this->column = this->column + (int)(pCVar3->var->name)._M_string_length;
      fill(this,&pCVar3->inFodder,true,true,indent->lineUp);
      goto LAB_001aad6e;
    }
    pCVar3 = pCVar3 + 1;
  } while( true );
}

Assistant:

void specs(std::vector<ComprehensionSpec> &specs, const Indent &indent)
    {
        for (auto &spec : specs) {
            fill(spec.openFodder, true, true, indent.lineUp);
            switch (spec.kind) {
                case ComprehensionSpec::FOR: {
                    column += 3;  // for
                    fill(spec.varFodder, true, true, indent.lineUp);
                    column += spec.var->name.length();
                    fill(spec.inFodder, true, true, indent.lineUp);
                    column += 2;  // in
                    Indent new_indent = newIndent(open_fodder(spec.expr), indent, column);
                    expr(spec.expr, new_indent, true);
                } break;

                case ComprehensionSpec::IF: {
                    column += 2;  // if
                    Indent new_indent = newIndent(open_fodder(spec.expr), indent, column);
                    expr(spec.expr, new_indent, true);
                } break;
            }
        }
    }